

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.h
# Opt level: O3

void __thiscall upb::generator::DefPoolPair::DefPoolPair(DefPoolPair *this)

{
  upb_DefPool *puVar1;
  
  puVar1 = upb_DefPool_New();
  (this->pool32_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)> =
       (_Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>)upb_DefPool_Free;
  (this->pool32_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = puVar1;
  puVar1 = upb_DefPool_New();
  (this->pool64_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
  super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false> =
       (_Head_base<1UL,_void_(*)(upb_DefPool_*),_false>)upb_DefPool_Free;
  (this->pool64_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = puVar1;
  _upb_DefPool_SetPlatform
            ((this->pool32_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
             _M_t.super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
             super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,kUpb_MiniTablePlatform_32Bit);
  _upb_DefPool_SetPlatform
            ((this->pool64_).ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
             _M_t.super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
             super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,kUpb_MiniTablePlatform_64Bit);
  return;
}

Assistant:

DefPoolPair() {
    pool32_._SetPlatform(kUpb_MiniTablePlatform_32Bit);
    pool64_._SetPlatform(kUpb_MiniTablePlatform_64Bit);
  }